

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_long_long lhs,
         SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_RSI;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  unsigned_long_long ret;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_long_long *in_stack_ffffffffffffffb8;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffc0;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffff8;
  
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_20);
  bVar1 = DivisionCornerCaseHelper<long,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(in_RSI.m_int,in_stack_fffffffffffffff8,in_RDI);
  if ((!bVar1) &&
     (bVar1 = DivisionCornerCaseHelper2<long,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
              ::DivisionCornerCase2((unsigned_long_long)in_RDI,in_RSI,&local_20), !bVar1)) {
    this = (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
           SafeInt::operator_cast_to_long(in_stack_ffffffffffffffc0);
    DivisionHelper<unsigned_long_long,_long,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((unsigned_long_long *)this,(long *)in_stack_ffffffffffffffb8,
               (unsigned_long_long *)0x2010b4);
    SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_long_long>
              (this,in_stack_ffffffffffffffb8);
    local_20.m_int = in_stack_fffffffffffffff8.m_int;
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_20.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}